

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_leaf_val_equal(lyd_node *node1,lyd_node *node2,int diff_ctx)

{
  int diff_ctx_local;
  lyd_node *node2_local;
  lyd_node *node1_local;
  
  if ((node1->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    __assert_fail("node1->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x77,"int lyd_leaf_val_equal(struct lyd_node *, struct lyd_node *, int)");
  }
  if (node1->schema->nodetype == node2->schema->nodetype) {
    if (diff_ctx == 0) {
      node1_local._4_4_ = (uint)(node1->ht == node2->ht);
    }
    else {
      node1_local._4_4_ = ly_strequal_((char *)node1->ht,(char *)node2->ht);
    }
    return node1_local._4_4_;
  }
  __assert_fail("node1->schema->nodetype == node2->schema->nodetype",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                ,0x78,"int lyd_leaf_val_equal(struct lyd_node *, struct lyd_node *, int)");
}

Assistant:

static int
lyd_leaf_val_equal(struct lyd_node *node1, struct lyd_node *node2, int diff_ctx)
{
    assert(node1->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST));
    assert(node1->schema->nodetype == node2->schema->nodetype);

    if (diff_ctx) {
        return ly_strequal(((struct lyd_node_leaf_list *)node1)->value_str, ((struct lyd_node_leaf_list *)node2)->value_str, 0);
    } else {
        return ly_strequal(((struct lyd_node_leaf_list *)node1)->value_str, ((struct lyd_node_leaf_list *)node2)->value_str, 1);
    }
}